

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O0

void __thiscall
MissingDependencyScanner::MissingDependencyScanner
          (MissingDependencyScanner *this,MissingDependencyScannerDelegate *delegate,
          DepsLog *deps_log,State *state,DiskInterface *disk_interface)

{
  DiskInterface *disk_interface_local;
  State *state_local;
  DepsLog *deps_log_local;
  MissingDependencyScannerDelegate *delegate_local;
  MissingDependencyScanner *this_local;
  
  this->delegate_ = delegate;
  this->deps_log_ = deps_log;
  this->state_ = state;
  this->disk_interface_ = disk_interface;
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::set(&this->seen_);
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::set(&this->nodes_missing_deps_);
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::set(&this->generated_nodes_);
  std::set<const_Rule_*,_std::less<const_Rule_*>,_std::allocator<const_Rule_*>_>::set
            (&this->generator_rules_);
  this->missing_dep_path_count_ = 0;
  std::
  unordered_map<Edge_*,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_std::unordered_map<Edge_*,_bool,_std::hash<Edge_*>,_std::equal_to<Edge_*>,_std::allocator<std::pair<Edge_*const,_bool>_>_>_>_>_>
  ::unordered_map(&this->adjacency_map_);
  return;
}

Assistant:

MissingDependencyScanner::MissingDependencyScanner(
    MissingDependencyScannerDelegate* delegate, DepsLog* deps_log, State* state,
    DiskInterface* disk_interface)
    : delegate_(delegate), deps_log_(deps_log), state_(state),
      disk_interface_(disk_interface), missing_dep_path_count_(0) {}